

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CardEffectsObserver.cpp
# Opt level: O2

void __thiscall CardEffectsObserver::update(CardEffectsObserver *this)

{
  int iVar1;
  ostream *poVar2;
  long lVar3;
  pointer pCVar4;
  char *pcVar5;
  vector<Cards,_std::allocator<Cards>_> topThree;
  Cards three;
  Cards two;
  Cards one;
  Cards card;
  vector<Cards,_std::allocator<Cards>_> local_228;
  string local_210;
  Cards local_1f0;
  Cards local_180;
  Cards local_110;
  Cards local_a0;
  
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "\n****************************************************************************"
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "-------------------- CARD EFFECT OBSERVER ----------------------------------"
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "****************************************************************************"
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  lVar3 = __dynamic_cast(this->concreteSubject,&Subject::typeinfo,&Game::typeinfo,0);
  DeckOfCards::topThreeCards(&local_228,(DeckOfCards *)(lVar3 + 0x60));
  Cards::Cards(&local_110,
               local_228.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.
               super__Vector_impl_data._M_start);
  Cards::Cards(&local_180,
               local_228.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.
               super__Vector_impl_data._M_start + 1);
  Cards::Cards(&local_1f0,
               local_228.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.
               super__Vector_impl_data._M_start + 2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Card 1 : ");
  poVar2 = operator<<(poVar2,&local_110);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Card 2 : ");
  poVar2 = operator<<(poVar2,&local_180);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Card 3 : ");
  poVar2 = operator<<(poVar2,&local_1f0);
  std::endl<char,std::char_traits<char>>(poVar2);
  pCVar4 = local_228.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    if (pCVar4 == local_228.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      Cards::~Cards(&local_1f0);
      Cards::~Cards(&local_180);
      Cards::~Cards(&local_110);
      std::vector<Cards,_std::allocator<Cards>_>::~vector(&local_228);
      return;
    }
    Cards::Cards(&local_a0,pCVar4);
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "****************************************************************************"
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"***********   The potential effect of card");
    Cards::getName_abi_cxx11_(&local_210,&local_a0);
    poVar2 = std::operator<<(poVar2,(string *)&local_210);
    poVar2 = std::operator<<(poVar2," is : **********************");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_210);
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "****************************************************************************"
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar1 = Cards::getId(&local_a0);
    pcVar5 = "Player will add 3 victory points IF he rolls more than 2 Ouches";
    switch(iVar1) {
    case 0:
      break;
    case 1:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
      goto switchD_001148fa_caseD_1;
    case 2:
      pcVar5 = "Player will removed 1 energy cube";
      break;
    case 3:
      pcVar5 = "Player will take 4 damage";
      break;
    case 9:
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "Player will add 1 energy cube IF he is in Manhattan");
      std::endl<char,std::char_traits<char>>(poVar2);
      pcVar5 = "Player will add 2 victory pts";
      break;
    default:
      if (iVar1 == 0x12) {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "Player will add 1 energy cube IF he is in Brooklyn");
        std::endl<char,std::char_traits<char>>(poVar2);
        pcVar5 = "Player will add 3 victory pts";
        break;
      }
      goto switchD_001148fa_caseD_1;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar2);
switchD_001148fa_caseD_1:
    Cards::~Cards(&local_a0);
    pCVar4 = pCVar4 + 1;
  } while( true );
}

Assistant:

void CardEffectsObserver::update() {

    cout << "\n****************************************************************************" << endl;

    cout << "-------------------- CARD EFFECT OBSERVER ----------------------------------" << endl;

    cout << "****************************************************************************" << endl;
    const vector<Cards> topThree =  dynamic_cast<Game*>(concreteSubject)->getGameDeck()->topThreeCards();

    Cards one = topThree[0];
    Cards two = topThree[1];
    Cards three = topThree[2];
    cout << "Card 1 : " << one << endl;
    cout << "Card 2 : " << two << endl;
    cout << "Card 3 : " << three << endl;


    for (const auto card: topThree){
        cout << "****************************************************************************" << endl;
        cout << "***********   The potential effect of card" << card.getName() << " is : **********************" << endl;
        cout << "****************************************************************************" << endl;
        switch(card.getId()){
            case 0:
                cout << "Player will add 3 victory points IF he rolls more than 2 Ouches" << endl;
                break;
            case 1:

                break;
            case 2:
                cout << "Player will removed 1 energy cube" << endl;
                break;
            case 3:
                cout << "Player will take 4 damage" << endl;
                break;
            case 4:

                break;
            case 5:

                break;
            case 6:

                break;
            case 7:

                break;
            case 8:

                break;
            case 9:
                cout << "Player will add 1 energy cube IF he is in Manhattan" << endl;
                cout << "Player will add 2 victory pts" << endl;
                break;
            case 18:
                cout << "Player will add 1 energy cube IF he is in Brooklyn" << endl;
                cout << "Player will add 3 victory pts" << endl;
                break;
        }
    }


}